

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

outer_range_iterator __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
::skip_while_less(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
                  *this,outer_range_iterator range,outer_range_iterator candidate)

{
  reference rVar1;
  reference rVar2;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  do {
    if (range._M_current == candidate._M_current) {
      return (outer_range_iterator)range._M_current;
    }
    rVar1 = boost::iterator_range_detail::
            iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                     *)range._M_current);
    rVar2 = boost::iterator_range_detail::
            iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                     *)candidate._M_current);
    if (rVar1 < rVar2) {
      rVar1 = boost::iterator_range_detail::
              iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
              ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                       *)candidate._M_current);
      uStack_28 = CONCAT44(rVar1,(undefined4)uStack_28);
      burst::detail::
      skip_to_lower_bound<boost::iterator_range<boost::range_detail::integer_iterator<int>>,int,std::less<void>>
                (range._M_current,(long)&uStack_28 + 4);
      if ((((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             *)range._M_current)->m_Begin).m_value ==
          (((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             *)range._M_current)->m_End).m_value) {
        return (outer_range_iterator)range._M_current;
      }
      rVar1 = boost::iterator_range_detail::
              iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
              ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                       *)candidate._M_current);
      rVar2 = boost::iterator_range_detail::
              iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
              ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                       *)range._M_current);
      if (rVar1 < rVar2) {
        return (outer_range_iterator)range._M_current;
      }
    }
    range._M_current =
         (iterator_range<boost::range_detail::integer_iterator<int>_> *)
         ((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
           *)range._M_current + 1);
  } while( true );
}

Assistant:

outer_range_iterator skip_while_less (outer_range_iterator range, outer_range_iterator candidate)
        {
            while (range != candidate)
            {
                if (m_compare(range->front(), candidate->front()))
                {
                    skip_to_lower_bound(*range, candidate->front(), m_compare);
                    if (range->empty() || m_compare(candidate->front(), range->front()))
                    {
                        break;
                    }
                }

                ++range;
            }

            return range;
        }